

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarSerializerWriteRawBytes(JsVarSerializerHandle serializerHandle,void *source,size_t length)

{
  anon_class_24_3_0b293bec fn;
  size_t local_28;
  size_t length_local;
  void *source_local;
  JsVarSerializerHandle serializerHandle_local;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else if (source == (void *)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.source = (void **)&length_local;
    fn.serializerHandle = &source_local;
    fn.length = &local_28;
    local_28 = length;
    length_local = (size_t)source;
    source_local = serializerHandle;
    serializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarSerializerWriteRawBytes::__0>(fn,false,false);
  }
  return serializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarSerializerWriteRawBytes(
    _In_ JsVarSerializerHandle serializerHandle,
    _In_ const void* source,
    _In_ size_t length)
{
    PARAM_NOT_NULL(serializerHandle);
    PARAM_NOT_NULL(source);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        streamWriter->WriteRawBytes(source, length);
        return JsNoError;
    });
}